

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O3

int lyd_wd_toprint(lyd_node *node,int options)

{
  lyd_node **pplVar1;
  byte bVar2;
  long lVar3;
  lyd_node_leaf_list *plVar4;
  int iVar5;
  LYS_NODE LVar6;
  lys_node *plVar7;
  lyd_node *plVar8;
  lyd_node_leaf_list *node_00;
  lyd_node *plVar9;
  lyd_node_leaf_list *plVar10;
  
  bVar2 = node->field_0x9;
  if ((options & 0x10U) == 0) {
    if ((options & 0xe0U) == 0 && (bVar2 & 1) != 0) {
      plVar7 = node->schema;
      if ((plVar7->flags & 2) == 0) {
        plVar7 = node->schema;
        bVar2 = (byte)plVar7->flags;
        plVar8 = node;
        do {
          if ((bVar2 & 2) != 0) {
            return 1;
          }
          if (((plVar7->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) ||
             (plVar9 = plVar8->child, plVar9 == (lyd_node *)0x0)) {
            if (plVar8 == node) {
              return 0;
            }
            plVar9 = plVar8->next;
            if (plVar9 == (lyd_node *)0x0) {
              plVar8 = plVar8->parent;
              do {
                if (plVar8->parent == node->parent) {
                  return 0;
                }
                plVar9 = plVar8->next;
                plVar8 = plVar8->parent;
              } while (plVar9 == (lyd_node *)0x0);
            }
          }
          plVar7 = plVar9->schema;
          bVar2 = (byte)plVar7->flags;
          plVar8 = plVar9;
        } while( true );
      }
    }
    else {
      if ((bVar2 & 1) == 0) {
        return 1;
      }
      plVar7 = node->schema;
    }
    if (((options & 4U) == 0) && (plVar7->nodetype == LYS_CONTAINER)) {
      LVar6 = node->schema->nodetype;
      plVar8 = node;
      while (LVar6 == LYS_CONTAINER) {
        plVar9 = plVar8->child;
        if (plVar9 == (lyd_node *)0x0) {
          if (plVar8 == node) {
            return 0;
          }
          plVar9 = plVar8->next;
          if (plVar9 == (lyd_node *)0x0) {
            plVar8 = plVar8->parent;
            do {
              if (plVar8->parent == node->parent) {
                return 0;
              }
              plVar9 = plVar8->next;
              plVar8 = plVar8->parent;
            } while (plVar9 == (lyd_node *)0x0);
          }
        }
        plVar8 = plVar9;
        LVar6 = plVar9->schema->nodetype;
      }
    }
  }
  else {
    if ((bVar2 & 1) != 0) {
      return 0;
    }
    plVar7 = node->schema;
    if ((plVar7->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      if (((plVar7->nodetype & LYS_CONTAINER) != LYS_UNKNOWN) &&
         (lVar3._0_2_ = plVar7[1].flags, lVar3._2_1_ = plVar7[1].ext_size,
         lVar3._3_1_ = plVar7[1].iffeature_size, lVar3._4_1_ = plVar7[1].padding[0],
         lVar3._5_1_ = plVar7[1].padding[1], lVar3._6_1_ = plVar7[1].padding[2],
         lVar3._7_1_ = plVar7[1].padding[3], lVar3 == 0)) {
        plVar10 = (lyd_node_leaf_list *)node->child;
LAB_00164cb4:
        plVar4 = plVar10;
        if (plVar10 == (lyd_node_leaf_list *)0x0) {
          return 0;
        }
LAB_00164cbc:
        node_00 = plVar4;
        if ((node_00->field_0x9 & 1) == 0) goto code_r0x00164cc5;
        goto LAB_00164ce8;
      }
    }
    else {
      iVar5 = lyd_wd_default((lyd_node_leaf_list *)node);
      if (iVar5 != 0) {
        return 0;
      }
    }
  }
  return 1;
code_r0x00164cc5:
  LVar6 = node_00->schema->nodetype;
  if ((LVar6 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
    iVar5 = lyd_wd_default(node_00);
    if (iVar5 == 0) {
      return 1;
    }
    LVar6 = node_00->schema->nodetype;
  }
  if (((LVar6 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) ||
     (plVar4 = (lyd_node_leaf_list *)node_00->value_str,
     (lyd_node_leaf_list *)node_00->value_str == (lyd_node_leaf_list *)0x0)) {
LAB_00164ce8:
    if (node_00 == plVar10) goto LAB_00164d20;
    plVar4 = (lyd_node_leaf_list *)node_00->next;
    if ((lyd_node_leaf_list *)node_00->next == (lyd_node_leaf_list *)0x0) {
      plVar8 = node_00->parent;
      do {
        if (plVar8->parent == plVar10->parent) goto LAB_00164d20;
        pplVar1 = &plVar8->next;
        plVar4 = (lyd_node_leaf_list *)*pplVar1;
        plVar8 = plVar8->parent;
      } while ((lyd_node_leaf_list *)*pplVar1 == (lyd_node_leaf_list *)0x0);
    }
  }
  goto LAB_00164cbc;
LAB_00164d20:
  plVar10 = (lyd_node_leaf_list *)plVar10->next;
  goto LAB_00164cb4;
}

Assistant:

int
lyd_wd_toprint(const struct lyd_node *node, int options)
{
    const struct lyd_node *subroot, *next, *elem;
    int flag = 0;

    if (options & LYP_WD_TRIM) {
        /* do not print default nodes */
        if (node->dflt) {
            /* implicit default node */
            return 0;
        } else if (node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
            if (lyd_wd_default((struct lyd_node_leaf_list *)node)) {
                /* explicit default node */
                return 0;
            }
        } else if ((node->schema->nodetype & (LYS_CONTAINER)) && !((struct lys_node_container *)node->schema)->presence) {
            /* get know if non-presence container contains non-default node */
            for (subroot = node->child; subroot && !flag; subroot = subroot->next) {
                LY_TREE_DFS_BEGIN(subroot, next, elem) {
                    if (elem->dflt) {
                        /* skip subtree */
                        goto trim_dfs_nextsibling;
                    } else if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                        if (!lyd_wd_default((struct lyd_node_leaf_list *)elem)) {
                            /* non-default node */
                            flag = 1;
                            break;
                        }
                    }

                    /* modified LY_TREE_DFS_END */
                    /* select element for the next run - children first */
                    /* child exception for leafs, leaflists and anyxml without children */
                    if (elem->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        next = NULL;
                    } else {
                        next = elem->child;
                    }
                    if (!next) {
trim_dfs_nextsibling:
                        /* no children */
                        if (elem == subroot) {
                            /* we are done, (START) has no children */
                            break;
                        }
                        /* try siblings */
                        next = elem->next;
                    }
                    while (!next) {
                        /* parent is already processed, go to its sibling */
                        elem = elem->parent;
                        /* no siblings, go back through parents */
                        if (elem->parent == subroot->parent) {
                            /* we are done, no next element to process */
                            break;
                        }
                        next = elem->next;
                    }
                }
            }
            if (!flag) {
                /* only default nodes in subtree, do not print the container */
                return 0;
            }
        }
    } else if (node->dflt && !(options & LYP_WD_MASK) && !(node->schema->flags & LYS_CONFIG_R)) {
        /* LYP_WD_EXPLICIT
         * - print only if it contains status data in its subtree */
        LY_TREE_DFS_BEGIN(node, next, elem) {
            if (elem->schema->flags & LYS_CONFIG_R) {
                flag = 1;
                break;
            }
            LY_TREE_DFS_END(node, next, elem)
        }
        if (!flag) {
            return 0;
        }
    } else if (node->dflt && node->schema->nodetype == LYS_CONTAINER && !(options & LYP_KEEPEMPTYCONT)) {
        /* avoid empty default containers */
        LY_TREE_DFS_BEGIN(node, next, elem) {
            if (elem->schema->nodetype != LYS_CONTAINER) {
                flag = 1;
                break;
            }
            LY_TREE_DFS_END(node, next, elem)
        }
        if (!flag) {
            return 0;
        }
    }

    return 1;
}